

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O3

bool __thiscall mau::DeliveryChannel::Initialize(DeliveryChannel *this,DeliveryCommonData *common)

{
  uint64_t uVar1;
  element_type *owner;
  uint64_t oldstate;
  ulong uVar2;
  pointer __p;
  waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *pwVar3;
  undefined1 local_58 [64];
  
  this->Common = common;
  LockedValue<MauChannelConfig_t>::Get((MauChannelConfig_t *)local_58,&common->ChannelConfig);
  uVar2 = local_58._0_8_ & 0xffffffff;
  if (uVar2 == 0) {
    uVar2 = GetRandomSeed();
  }
  uVar1 = uVar2 * 2 + 1;
  (this->LossRNG).Inc = uVar1;
  (this->LossRNG).State = uVar1 * 0x5851f42d4c957f2e;
  owner = (common->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __p = (pointer)operator_new(0x40,(nothrow_t *)&std::nothrow);
  if (__p != (pointer)0x0) {
    local_58._0_8_ =
         &asio::detail::
          typeid_wrapper<asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          ::typeinfo;
    local_58._8_8_ = (id *)0x0;
    pwVar3 = (waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
              *)asio::detail::service_registry::do_use_service
                          ((owner->super_execution_context).service_registry_,(key *)local_58,
                           asio::detail::service_registry::
                           create<asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>,asio::io_context>
                           ,owner);
    (__p->
    super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
    ).service_ = pwVar3;
    (__p->
    super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
    ).implementation_.timer_data.op_queue_.front_ = (wait_op *)0x0;
    (__p->
    super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
    ).implementation_.timer_data.op_queue_.back_ = (wait_op *)0x0;
    (__p->
    super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
    ).implementation_.timer_data.heap_index_ = 0xffffffffffffffff;
    (__p->
    super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
    ).implementation_.timer_data.next_ = (per_timer_data *)0x0;
    (__p->
    super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
    ).implementation_.timer_data.prev_ = (per_timer_data *)0x0;
    (__p->
    super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
    ).implementation_.expiry.__d.__r = 0;
    (__p->
    super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
    ).implementation_.might_have_pending_waits = false;
  }
  std::
  __uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
           *)this,__p);
  return (this->DeliveryTimer)._M_t.
         super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
         .
         super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
         ._M_head_impl !=
         (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *)0x0;
}

Assistant:

bool DeliveryChannel::Initialize(DeliveryCommonData* common)
{
    Common = common;

    uint64_t seed = Common->ChannelConfig.Get().RNGSeed;
    if (seed == 0) {
        seed = GetRandomSeed();
    }
    LossRNG.Seed(seed);

    DeliveryTimer = MakeUniqueNoThrow<asio::steady_timer>(*common->Context);
    if (!DeliveryTimer) {
        return false;
    }

    return true;
}